

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_dynlight.cpp
# Opt level: O3

double __thiscall ADynamicLight::DistToSeg(ADynamicLight *this,DVector3 *pos,seg_t *seg)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar3 = (seg->v1->p).X;
  dVar4 = (seg->v1->p).Y;
  dVar1 = (seg->v2->p).X - dVar3;
  dVar2 = (seg->v2->p).Y - dVar4;
  dVar6 = (dVar2 * (pos->Y - dVar4) + (pos->X - dVar3) * dVar1) / (dVar1 * dVar1 + dVar2 * dVar2);
  dVar5 = 0.0;
  if ((0.0 <= dVar6) && (dVar5 = dVar6, 1.0 < dVar6)) {
    dVar5 = 1.0;
  }
  dVar3 = (dVar3 - pos->X) + dVar5 * dVar1;
  dVar4 = (dVar4 - pos->Y) + dVar5 * dVar2;
  return dVar4 * dVar4 + dVar3 * dVar3;
}

Assistant:

double ADynamicLight::DistToSeg(const DVector3 &pos, seg_t *seg)
{
	double u, px, py;

	double seg_dx = seg->v2->fX() - seg->v1->fX();
	double seg_dy = seg->v2->fY() - seg->v1->fY();
	double seg_length_sq = seg_dx * seg_dx + seg_dy * seg_dy;

	u = (((pos.X - seg->v1->fX()) * seg_dx) + (pos.Y - seg->v1->fY()) * seg_dy) / seg_length_sq;
	if (u < 0.) u = 0.; // clamp the test point to the line segment
	else if (u > 1.) u = 1.;

	px = seg->v1->fX() + (u * seg_dx);
	py = seg->v1->fY() + (u * seg_dy);

	px -= pos.X;
	py -= pos.Y;

	return (px*px) + (py*py);
}